

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O1

void __thiscall
Js::
CopyRemovePolicy<JsUtil::List<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
::Remove(CopyRemovePolicy<JsUtil::List<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
         *this,List<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *list,TElementType *item)

{
  Type pPVar1;
  Type pPVar2;
  LabelInstr *pLVar3;
  undefined4 uVar4;
  Type pPVar5;
  long lVar6;
  int iVar7;
  
  iVar7 = (list->
          super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
          ).count;
  if (0 < iVar7) {
    pPVar1 = (list->
             super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
             ).buffer;
    lVar6 = 1;
    pPVar2 = pPVar1;
    do {
      pPVar5 = pPVar2 + 1;
      if ((pPVar2->first == item->first) && (pPVar2->second == item->second)) {
        iVar7 = (list->
                super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
                ).count;
        if ((int)lVar6 < iVar7) {
          do {
            iVar7 = (int)lVar6 + -1;
            pPVar1[iVar7].initialized = pPVar5->initialized;
            uVar4 = *(undefined4 *)&pPVar5->field_0x4;
            pLVar3 = pPVar5->second;
            pPVar2 = pPVar1 + iVar7;
            pPVar2->first = pPVar5->first;
            *(undefined4 *)&pPVar2->field_0x4 = uVar4;
            pPVar2->second = pLVar3;
            lVar6 = lVar6 + 1;
            iVar7 = (list->
                    super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
                    ).count;
            pPVar5 = pPVar5 + 1;
          } while (lVar6 < iVar7);
        }
        iVar7 = iVar7 + -1;
        (list->
        super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
        ).count = iVar7;
        *(undefined8 *)(pPVar1 + iVar7) = 0;
        pPVar1[iVar7].second = (LabelInstr *)0x0;
        *(undefined8 *)&pPVar1[iVar7].initialized = 0;
        return;
      }
      lVar6 = lVar6 + 1;
      pPVar2 = pPVar5;
    } while ((int)lVar6 - iVar7 != 1);
  }
  return;
}

Assistant:

void Remove(TListType* list, const TElementType& item)
        {
            TElementType* buffer = list->buffer;
            int& count = list->count;

            for (int i = 0; i < count; i++)
            {
                if (TComparerType::Equals(buffer[i], item))
                {
                    for (int j = i + 1; j < count; i++, j++)
                    {
                        buffer[i] = buffer[j];
                    }
                    count--;

                    if (clearOldEntries)
                    {
                        ClearArray(buffer + count, 1);
                    }
                    break;
                }
            }
        }